

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void accept_bribe(tgestate_t *state)

{
  tgestate_t *in_RDI;
  vischar_t *vischar;
  uint8_t iters;
  item_t *item;
  route_t *route;
  vischar_t *local_28;
  char local_19;
  item_t *local_18;
  
  increase_morale_by_10_score_by_50((tgestate_t *)0x10d795);
  in_RDI->IY->flags = '\0';
  get_target_assign_pos((tgestate_t *)vischar,(vischar_t *)in_RDI,&in_RDI->IY->route);
  local_18 = in_RDI->items_held;
  if ((*local_18 == '\x05') || (local_18 = in_RDI->items_held + 1, in_RDI->items_held[1] == '\x05'))
  {
    *local_18 = 0xff;
    in_RDI->item_structs[5].room_and_flags = '?';
    draw_all_items((tgestate_t *)0x10d82f);
    local_19 = '\a';
    local_28 = in_RDI->vischars;
    do {
      local_28 = local_28 + 1;
      if (local_28->character < 0x14) {
        local_28->flags = '\x04';
      }
      local_19 = local_19 + -1;
    } while (local_19 != '\0');
    queue_message(in_RDI,message_HE_TAKES_THE_BRIBE);
    queue_message(in_RDI,message_AND_ACTS_AS_DECOY);
  }
  return;
}

Assistant:

void accept_bribe(tgestate_t *state)
{
  route_t    *route;  /* was HL */
  item_t    *item;    /* was DE */
  uint8_t    iters;   /* was B */
  vischar_t *vischar; /* was HL */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(state->IY);

  increase_morale_by_10_score_by_50(state);

  /* Clear the vischar_PURSUIT_PURSUE flag. */
  state->IY->flags = 0;

  route = &state->IY->route;
  get_target_assign_pos(state, state->IY, route);

  /* Return early if we have no bribes. */
  item = &state->items_held[0];
  if (*item != item_BRIBE && *++item != item_BRIBE)
    return;

  /* Remove the bribe item. */
  *item = item_NONE;
  state->item_structs[item_BRIBE].room_and_flags = (room_t) itemstruct_ROOM_NONE;
  draw_all_items(state);

  /* Set the vischar_PURSUIT_SAW_BRIBE flag on all visible hostiles. */
  iters   = vischars_LENGTH - 1;
  vischar = &state->vischars[1];
  do
  {
    if (vischar->character <= character_19_GUARD_DOG_4)
      vischar->flags = vischar_PURSUIT_SAW_BRIBE;
    vischar++;
  }
  while (--iters);

  queue_message(state, message_HE_TAKES_THE_BRIBE);
  queue_message(state, message_AND_ACTS_AS_DECOY);
}